

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O0

void __thiscall CECorrections::free_members(CECorrections *this)

{
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x12fc5c);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x12fc6d);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x12fc7e);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x12fc8f);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x12fca0);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x12fcb1);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x12fcc2);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x12fcd3);
  return;
}

Assistant:

void CECorrections::free_members(void)
{
    // Clear the nutation vectors
    nutation_mjd_.clear();
    nutation_dut1_.clear();
    nutation_xp_.clear();
    nutation_yp_.clear();
    nutation_deps_.clear();
    nutation_dpsi_.clear();

    // Clear the TT-UT1 vectors
    ttut1_mjd_.clear();
    ttut1_delt_.clear();
}